

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::copy_from(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
            *this,dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                  *ht,size_type min_buckets_wanted)

{
  uint *puVar1;
  pointer ppVar2;
  size_type sVar3;
  vector<CMString,_std::allocator<CMString>_> *pvVar4;
  undefined7 uVar5;
  bool bVar6;
  size_type new_num_buckets;
  ulong uVar7;
  ulong uVar8;
  const_iterator it;
  const_iterator local_60;
  const_iterator local_48;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  clear_to_size(this,new_num_buckets);
  if ((this->num_buckets & this->num_buckets - 1) != 0) {
    __assert_fail("(bucket_count() & (bucket_count()-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                  ,0x283,
                  "void google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::copy_from(const dense_hashtable<Value, Key, HashFcn, ExtractKey, SetKey, EqualKey, Alloc> &, size_type) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                 );
  }
  begin(&local_60,ht);
  do {
    end(&local_48,ht);
    if (local_60.pos == local_48.pos) {
      puVar1 = &(this->settings).
                super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.num_ht_copies_;
      *puVar1 = *puVar1 + 1;
      return;
    }
    sVar3 = this->num_buckets;
    uVar7 = (ulong)(local_60.pos)->first;
    uVar8 = 0;
    while( true ) {
      uVar7 = uVar7 & sVar3 - 1;
      bVar6 = test_empty(this,uVar7);
      if (bVar6) break;
      uVar7 = uVar7 + uVar8 + 1;
      uVar8 = uVar8 + 1;
      if (this->num_buckets <= uVar8) {
        __assert_fail("num_probes < bucket_count() && \"Hashtable is full: an error in key_equal<> or hash<>\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                      ,0x28d,
                      "void google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::copy_from(const dense_hashtable<Value, Key, HashFcn, ExtractKey, SetKey, EqualKey, Alloc> &, size_type) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                     );
      }
    }
    uVar5 = *(undefined7 *)&(local_60.pos)->field_0x1;
    pvVar4 = (local_60.pos)->second;
    ppVar2 = this->table + uVar7;
    ppVar2->first = (local_60.pos)->first;
    *(undefined7 *)&ppVar2->field_0x1 = uVar5;
    ppVar2->second = pvVar4;
    this->num_elements = this->num_elements + 1;
    dense_hashtable_const_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

void copy_from(const dense_hashtable &ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count()-1)) == 0);      // a power of two
    for ( const_iterator it = ht.begin(); it != ht.end(); ++it ) {
      size_type num_probes = 0;              // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(*it)) & bucket_count_minus_one;
           !test_empty(bucknum);                               // not empty
           bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count()
               && "Hashtable is full: an error in key_equal<> or hash<>");
      }
      set_value(&table[bucknum], *it);       // copies the value to here
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }